

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall
helics::MessageFederate::registerMessageInterfaces(MessageFederate *this,string *configString)

{
  string_view configString_00;
  ConfigType CVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  __sv_type _Var2;
  invalid_argument *e;
  ConfigType hint;
  string *in_stack_000004d8;
  MessageFederate *in_stack_000004e0;
  string *in_stack_ffffffffffffffc8;
  MessageFederate *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  configString_00._M_str._0_4_ = in_stack_ffffffffffffffe8;
  configString_00._M_len = (size_t)_Var2._M_str;
  configString_00._M_str._4_4_ = in_stack_ffffffffffffffec;
  CVar1 = fileops::getConfigType(configString_00);
  if (CVar1 < TOML_STRING) {
    registerMessageInterfacesJson(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else if (CVar1 - TOML_STRING < 2) {
    registerMessageInterfacesToml(in_stack_000004e0,in_stack_000004d8);
  }
  return;
}

Assistant:

void MessageFederate::registerMessageInterfaces(const std::string& configString)
{
    auto hint = fileops::getConfigType(configString);
    switch (hint) {
        case fileops::ConfigType::JSON_FILE:
        case fileops::ConfigType::JSON_STRING:
            try {
                registerMessageInterfacesJson(configString);
            }
            catch (const std::invalid_argument& e) {
                throw(helics::InvalidParameter(e.what()));
            }
            break;
        case fileops::ConfigType::TOML_FILE:
        case fileops::ConfigType::TOML_STRING:
            registerMessageInterfacesToml(configString);
            break;
        case fileops::ConfigType::NONE:
        default:
            break;
    }
}